

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_rkv_reg.c
# Opt level: O1

MPP_RET rkv_h264d_deinit(void *hal)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  ulong uVar4;
  bool bVar5;
  
  lVar2 = *(long *)((long)hal + 0x90);
  iVar1 = *(int *)((long)hal + 0x98);
  puVar3 = (undefined8 *)(lVar2 + 0x2b0);
  uVar4 = 0;
  do {
    if ((void *)*puVar3 != (void *)0x0) {
      mpp_osal_free("rkv_h264d_deinit",(void *)*puVar3);
    }
    *puVar3 = 0;
    mpp_buffer_put_with_caller((MppBuffer)puVar3[-3],"rkv_h264d_deinit");
    mpp_buffer_put_with_caller((MppBuffer)puVar3[-2],"rkv_h264d_deinit");
    mpp_buffer_put_with_caller((MppBuffer)puVar3[-1],"rkv_h264d_deinit");
    if (iVar1 == 0) break;
    puVar3 = puVar3 + 5;
    bVar5 = uVar4 < 2;
    uVar4 = uVar4 + 1;
  } while (bVar5);
  mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x280),"rkv_h264d_deinit");
  mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x288),"rkv_h264d_deinit");
  if (*(void **)((long)hal + 0x90) != (void *)0x0) {
    mpp_osal_free("rkv_h264d_deinit",*(void **)((long)hal + 0x90));
  }
  *(undefined8 *)((long)hal + 0x90) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET rkv_h264d_deinit(void *hal)
{
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;
    H264dRkvRegCtx_t *reg_ctx = (H264dRkvRegCtx_t *)p_hal->reg_ctx;

    RK_U32 i = 0;
    RK_U32 loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;
    for (i = 0; i < loop; i++) {
        MPP_FREE(reg_ctx->reg_buf[i].regs);
        mpp_buffer_put(reg_ctx->reg_buf[i].spspps);
        mpp_buffer_put(reg_ctx->reg_buf[i].rps);
        mpp_buffer_put(reg_ctx->reg_buf[i].sclst);
    }
    mpp_buffer_put(reg_ctx->cabac_buf);
    mpp_buffer_put(reg_ctx->errinfo_buf);
    MPP_FREE(p_hal->reg_ctx);

    return MPP_OK;
}